

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_3::BindFromPosition
          (anon_unknown_3 *this,int position,int *value,
          Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> pack)

{
  FormatArgImpl arg;
  size_type sVar1;
  reference pFVar2;
  undefined4 in_register_00000034;
  int iVar3;
  int *value_local;
  undefined1 auStack_20 [4];
  int position_local;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> pack_local;
  
  arg.dispatcher_._4_4_ = in_register_00000034;
  arg.dispatcher_._0_4_ = position;
  pack_local.ptr_ = pack.ptr_;
  iVar3 = (int)this;
  _auStack_20 = (pointer)value;
  if (0 < iVar3) {
    sVar1 = Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>::size
                      ((Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> *)
                       auStack_20);
    if (sVar1 < (ulong)(long)iVar3) {
      pack_local.len_._7_1_ = false;
    }
    else {
      pFVar2 = Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>::operator[]
                         ((Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> *)
                          auStack_20,(long)iVar3 - 1);
      arg.data_ = (Data)(Data)pFVar2->dispatcher_;
      pack_local.len_._7_1_ =
           FormatArgImplFriend::ToInt<absl::lts_20250127::str_format_internal::FormatArgImpl>
                     ((FormatArgImplFriend *)(pFVar2->data_).ptr,arg,(int *)(pFVar2->data_).ptr);
    }
    return pack_local.len_._7_1_;
  }
  __assert_fail("position > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/bind.cc"
                ,0x2c,
                "bool absl::str_format_internal::(anonymous namespace)::BindFromPosition(int, int *, absl::Span<const FormatArgImpl>)"
               );
}

Assistant:

inline bool BindFromPosition(int position, int* value,
                             absl::Span<const FormatArgImpl> pack) {
  assert(position > 0);
  if (static_cast<size_t>(position) > pack.size()) {
    return false;
  }
  // -1 because positions are 1-based
  return FormatArgImplFriend::ToInt(pack[static_cast<size_t>(position) - 1],
                                    value);
}